

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O0

PubkeyDataStruct * __thiscall
cfd::js::api::KeyStructApi::NegatePubkey::anon_class_1_0_00000001::operator()
          (PubkeyDataStruct *__return_storage_ptr__,anon_class_1_0_00000001 *this,
          PubkeyDataStruct *request)

{
  Pubkey local_88;
  string local_70 [48];
  undefined1 local_40 [8];
  Pubkey pubkey;
  PubkeyDataStruct *request_local;
  anon_class_1_0_00000001 *this_local;
  PubkeyDataStruct *response;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  PubkeyDataStruct::PubkeyDataStruct(__return_storage_ptr__);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_40,(string *)request);
  cfd::core::Pubkey::CreateNegate();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_70);
  std::__cxx11::string::~string(local_70);
  core::Pubkey::~Pubkey(&local_88);
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  core::Pubkey::~Pubkey((Pubkey *)local_40);
  if ((pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    PubkeyDataStruct::~PubkeyDataStruct(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PubkeyDataStruct KeyStructApi::NegatePubkey(const PubkeyDataStruct& request) {
  auto call_func = [](const PubkeyDataStruct& request) -> PubkeyDataStruct {
    PubkeyDataStruct response;
    Pubkey pubkey(request.pubkey);
    response.pubkey = pubkey.CreateNegate().GetHex();
    return response;
  };

  PubkeyDataStruct result;
  result = ExecuteStructApi<PubkeyDataStruct, PubkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}